

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::Clamp(Bignum *this)

{
  uint *puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)this->used_digits_;
  puVar1 = (this->bigits_).start_;
  while (0 < (int)uVar2) {
    if (puVar1[(int)uVar2 - 1] != 0) {
      return;
    }
    uVar2 = uVar2 - 1;
    this->used_digits_ = (int)uVar2;
  }
  if (uVar2 != 0) {
    return;
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}